

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseParamList(ParserImpl *this)

{
  TokenDetail *this_00;
  TokenDetail *pTVar1;
  undefined8 uVar2;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_01;
  char *in_RSI;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> in_RDI;
  unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_> names;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> name_list;
  bool vararg;
  pointer in_stack_ffffffffffffff28;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *__p;
  ParserImpl *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  TokenDetail *in_stack_ffffffffffffff40;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_40 [5];
  undefined1 local_11;
  
  local_11 = 0;
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff30);
  this_00 = LookAhead(in_stack_ffffffffffffff30);
  if (this_00->token_ == 0x115) {
    operator_new(0x20);
    luna::NameList::NameList((NameList *)in_stack_ffffffffffffff30);
    std::unique_ptr<luna::NameList,std::default_delete<luna::NameList>>::
    unique_ptr<std::default_delete<luna::NameList>,void>
              ((unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_>::operator->
              ((unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_> *)0x1d8563);
    NextToken(in_stack_ffffffffffffff30);
    std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
              ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    while( true ) {
      pTVar1 = LookAhead(in_stack_ffffffffffffff30);
      if (pTVar1->token_ != 0x2c) break;
      NextToken(in_stack_ffffffffffffff30);
      pTVar1 = LookAhead(in_stack_ffffffffffffff30);
      if (pTVar1->token_ != 0x115) {
        pTVar1 = LookAhead(in_stack_ffffffffffffff30);
        if (pTVar1->token_ != 0x11d) {
          uVar2 = __cxa_allocate_exception(0x20);
          luna::ParseException::ParseException
                    ((ParseException *)this_00,in_RSI,(TokenDetail *)in_RDI._M_head_impl);
          __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
        }
        NextToken(in_stack_ffffffffffffff30);
        local_11 = 1;
        break;
      }
      std::unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_>::operator->
                ((unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_> *)0x1d85f8);
      NextToken(in_stack_ffffffffffffff30);
      std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
                ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff40,
               (unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_> *)
               in_stack_ffffffffffffff38);
    std::unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_>::~unique_ptr
              ((unique_ptr<luna::NameList,_std::default_delete<luna::NameList>_> *)
               in_stack_ffffffffffffff30);
  }
  else {
    in_stack_ffffffffffffff40 = LookAhead(in_stack_ffffffffffffff30);
    if (in_stack_ffffffffffffff40->token_ != 0x11d) {
      uVar2 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                ((ParseException *)this_00,in_RSI,(TokenDetail *)in_RDI._M_head_impl);
      __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    NextToken(in_stack_ffffffffffffff30);
    local_11 = 1;
  }
  this_01 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
            operator_new(0x20);
  __p = local_40;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr(this_01,__p)
  ;
  luna::ParamList::ParamList
            ((ParamList *)in_stack_ffffffffffffff40,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff38,SUB81((ulong)this_01 >> 0x38,0));
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>(this_01,(pointer)__p);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff40);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff40);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseParamList()
        {
            bool vararg = false;
            std::unique_ptr<SyntaxTree> name_list;

            if (LookAhead().token_ == Token_Id)
            {
                std::unique_ptr<NameList> names(new NameList);
                names->names_.push_back(NextToken());

                while (LookAhead().token_ == ',')
                {
                    NextToken();        // skip ','
                    if (LookAhead().token_ == Token_Id)
                        names->names_.push_back(NextToken());
                    else if (LookAhead().token_ == Token_VarArg)
                    {
                        NextToken();    // skip Token_VarArg
                        vararg = true;
                        break;
                    }
                    else
                        throw ParseException("unexpect token in param list", look_ahead_);
                }

                name_list = std::move(names);
            }
            else if (LookAhead().token_ == Token_VarArg)
            {
                NextToken();            // skip Token_VarArg
                vararg = true;
            }
            else
                throw ParseException("unexpect token in param list", look_ahead_);

            return std::unique_ptr<SyntaxTree>(new ParamList(std::move(name_list), vararg));
        }